

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O0

void lysc_ident_free(lysf_ctx *ctx,lysc_ident *ident)

{
  void *local_30;
  void *local_20;
  uint64_t c__;
  lysc_ident *ident_local;
  lysf_ctx *ctx_local;
  
  lydict_remove(ctx->ctx,ident->name);
  lydict_remove(ctx->ctx,ident->dsc);
  lydict_remove(ctx->ctx,ident->ref);
  if (ident->derived != (lysc_ident **)0x0) {
    free(ident->derived + -1);
  }
  local_20 = (void *)0x0;
  while( true ) {
    if (ident->exts == (lysc_ext_instance *)0x0) {
      local_30 = (void *)0x0;
    }
    else {
      local_30 = ident->exts[-1].compiled;
    }
    if (local_30 <= local_20) break;
    lysc_ext_instance_free(ctx,ident->exts + (long)local_20);
    local_20 = (void *)((long)local_20 + 1);
  }
  if (ident->exts != (lysc_ext_instance *)0x0) {
    free(&ident->exts[-1].compiled);
  }
  return;
}

Assistant:

static void
lysc_ident_free(struct lysf_ctx *ctx, struct lysc_ident *ident)
{
    lydict_remove(ctx->ctx, ident->name);
    lydict_remove(ctx->ctx, ident->dsc);
    lydict_remove(ctx->ctx, ident->ref);
    LY_ARRAY_FREE(ident->derived);
    FREE_ARRAY(ctx, ident->exts, lysc_ext_instance_free);
}